

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int parse_array(frozen *f)

{
  int iVar1;
  int iVar2;
  int _n_3;
  int _n_2;
  int _n_1;
  int _n;
  int ind;
  frozen *f_local;
  
  f_local._4_4_ = test_and_skip(f,0x5b);
  if ((-1 < f_local._4_4_) &&
     (f_local._4_4_ = capture_ptr(f,f->cur + -1,JSON_TYPE_ARRAY), -1 < f_local._4_4_)) {
    iVar1 = f->num_tokens;
    while (iVar2 = cur(f), iVar2 != 0x5d) {
      iVar2 = parse_value(f);
      if (iVar2 < 0) {
        return iVar2;
      }
      iVar2 = cur(f);
      if (iVar2 == 0x2c) {
        f->cur = f->cur + 1;
      }
    }
    f_local._4_4_ = test_and_skip(f,0x5d);
    if (-1 < f_local._4_4_) {
      capture_len(f,iVar1 + -1,f->cur);
      f_local._4_4_ = 0;
    }
  }
  return f_local._4_4_;
}

Assistant:

static int parse_array(struct frozen *f) {
    int ind;
    TRY(test_and_skip(f, '['));
    TRY(capture_ptr(f, f->cur - 1, JSON_TYPE_ARRAY));
    ind = f->num_tokens - 1;
    while (cur(f) != ']') {
        TRY(parse_value(f));
        if (cur(f) == ',') f->cur++;
    }
    TRY(test_and_skip(f, ']'));
    capture_len(f, ind, f->cur);
    return 0;
}